

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_inverse_scalar(secp256k1_scalar *out,secp256k1_scalar *x,int var)

{
  undefined4 extraout_EAX;
  int iVar1;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  uint32_t uVar2;
  long *extraout_RDX;
  long lVar3;
  long lVar4;
  secp256k1_scalar *r_00;
  secp256k1_scalar *psVar5;
  uchar *__s;
  size_t count;
  code *pcVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  secp256k1_scalar l;
  secp256k1_scalar r;
  secp256k1_scalar t;
  ulong uStack_1140;
  secp256k1_scalar *psStack_1138;
  uchar auStack_1130 [4232];
  secp256k1_scalar *psStack_a8;
  secp256k1_scalar local_78;
  secp256k1_scalar local_58;
  secp256k1_scalar local_38;
  
  psVar5 = &local_78;
  pcVar6 = secp256k1_scalar_inverse_var;
  if (var == 0) {
    pcVar6 = secp256k1_scalar_inverse;
  }
  (*pcVar6)(&local_78);
  if (out != (secp256k1_scalar *)0x0) {
    out->d[2] = CONCAT44(local_78.d[2]._4_4_,(int)local_78.d[2]);
    out->d[3] = CONCAT44(local_78.d[3]._4_4_,(int)local_78.d[3]);
    out->d[0] = CONCAT44(local_78.d[0]._4_4_,(int)local_78.d[0]);
    out->d[1] = CONCAT44(local_78.d[1]._4_4_,(int)local_78.d[1]);
  }
  secp256k1_scalar_verify(x);
  auVar7._0_4_ = -(uint)((int)x->d[2] == 0 && (int)x->d[0] == 0);
  auVar7._4_4_ = -(uint)(*(int *)((long)x->d + 0x14) == 0 && *(int *)((long)x->d + 4) == 0);
  auVar7._8_4_ = -(uint)((int)x->d[3] == 0 && (int)x->d[1] == 0);
  auVar7._12_4_ = -(uint)(*(int *)((long)x->d + 0x1c) == 0 && *(int *)((long)x->d + 0xc) == 0);
  iVar1 = movmskps(extraout_EAX,auVar7);
  if (iVar1 != 0xf) {
    r_00 = &local_38;
    secp256k1_scalar_mul(r_00,x,&local_78);
    secp256k1_scalar_verify(r_00);
    if (((local_38.d[0] != 1 || local_38.d[1] != 0) || local_38.d[2] != 0) || local_38.d[3] != 0) {
      test_inverse_scalar_cold_1();
      goto LAB_0015681b;
    }
    secp256k1_scalar_add(&local_58,x,&scalar_minus_one);
    secp256k1_scalar_verify(&local_58);
    auVar8._0_4_ = -(uint)((int)local_58.d[2] == 0 && (int)local_58.d[0] == 0);
    auVar8._4_4_ = -(uint)(local_58.d[2]._4_4_ == 0 && local_58.d[0]._4_4_ == 0);
    auVar8._8_4_ = -(uint)((int)local_58.d[3] == 0 && (int)local_58.d[1] == 0);
    auVar8._12_4_ = -(uint)(local_58.d[3]._4_4_ == 0 && local_58.d[1]._4_4_ == 0);
    iVar1 = movmskps(extraout_EAX_00,auVar8);
    if (iVar1 == 0xf) {
      return;
    }
    (*pcVar6)(&local_58,&local_58);
    secp256k1_scalar_add(&local_78,&scalar_minus_one,&local_78);
    (*pcVar6)(&local_78,&local_78);
    secp256k1_scalar_add(&local_78,&local_78,&secp256k1_scalar_one);
    secp256k1_scalar_add(&local_78,&local_58,&local_78);
    secp256k1_scalar_verify(&local_78);
    auVar9._0_4_ = -(uint)((int)local_78.d[2] == 0 && (int)local_78.d[0] == 0);
    auVar9._4_4_ = -(uint)(local_78.d[2]._4_4_ == 0 && local_78.d[0]._4_4_ == 0);
    auVar9._8_4_ = -(uint)((int)local_78.d[3] == 0 && (int)local_78.d[1] == 0);
    auVar9._12_4_ = -(uint)(local_78.d[3]._4_4_ == 0 && local_78.d[1]._4_4_ == 0);
    iVar1 = movmskps(extraout_EAX_01,auVar9);
    if (iVar1 == 0xf) {
      return;
    }
    test_inverse_scalar_cold_2();
  }
  secp256k1_scalar_verify(&local_78);
  auVar10._0_4_ = -(uint)((int)local_78.d[2] == 0 && (int)local_78.d[0] == 0);
  auVar10._4_4_ = -(uint)(local_78.d[2]._4_4_ == 0 && local_78.d[0]._4_4_ == 0);
  auVar10._8_4_ = -(uint)((int)local_78.d[3] == 0 && (int)local_78.d[1] == 0);
  auVar10._12_4_ = -(uint)(local_78.d[3]._4_4_ == 0 && local_78.d[1]._4_4_ == 0);
  iVar1 = movmskps(extraout_EAX_02,auVar10);
  x = &local_78;
  r_00 = psVar5;
  if (iVar1 == 0xf) {
    return;
  }
LAB_0015681b:
  test_inverse_scalar_cold_3();
  __s = auStack_1130;
  psStack_a8 = x;
  memset(__s,0,0x1081);
  uStack_1140 = 0;
  lVar4 = 0x41;
  psStack_1138 = r_00;
  secp256k1_hsort(__s,0x41,(size_t)r_00,test_hsort_cmp,&uStack_1140);
  if (0x3f < uStack_1140) {
    test_hsort_is_sorted(auStack_1130,0x41,(size_t)r_00);
    if (0 < COUNT) {
      iVar1 = 0;
      do {
        uVar2 = testrand_int(0x41);
        count = (size_t)(int)uVar2;
        testrand_bytes_test(auStack_1130,count * (long)r_00);
        secp256k1_hsort(auStack_1130,count,(size_t)r_00,test_hsort_cmp,&uStack_1140);
        test_hsort_is_sorted(auStack_1130,count,(size_t)r_00);
        iVar1 = iVar1 + 1;
      } while (iVar1 < COUNT);
    }
    return;
  }
  test_hsort_cold_1();
  *extraout_RDX = *extraout_RDX + 1;
  if (extraout_RDX[1] != 0) {
    lVar3 = 0;
    do {
      if (__s[lVar3] != *(uchar *)(lVar4 + lVar3)) {
        return;
      }
      lVar3 = lVar3 + 1;
    } while (extraout_RDX[1] != lVar3);
  }
  return;
}

Assistant:

static void test_inverse_scalar(secp256k1_scalar* out, const secp256k1_scalar* x, int var)
{
    secp256k1_scalar l, r, t;

    (var ? secp256k1_scalar_inverse_var : secp256k1_scalar_inverse)(&l, x);  /* l = 1/x */
    if (out) *out = l;
    if (secp256k1_scalar_is_zero(x)) {
        CHECK(secp256k1_scalar_is_zero(&l));
        return;
    }
    secp256k1_scalar_mul(&t, x, &l);                                             /* t = x*(1/x) */
    CHECK(secp256k1_scalar_is_one(&t));                                          /* x*(1/x) == 1 */
    secp256k1_scalar_add(&r, x, &scalar_minus_one);                              /* r = x-1 */
    if (secp256k1_scalar_is_zero(&r)) return;
    (var ? secp256k1_scalar_inverse_var : secp256k1_scalar_inverse)(&r, &r); /* r = 1/(x-1) */
    secp256k1_scalar_add(&l, &scalar_minus_one, &l);                             /* l = 1/x-1 */
    (var ? secp256k1_scalar_inverse_var : secp256k1_scalar_inverse)(&l, &l); /* l = 1/(1/x-1) */
    secp256k1_scalar_add(&l, &l, &secp256k1_scalar_one);                         /* l = 1/(1/x-1)+1 */
    secp256k1_scalar_add(&l, &r, &l);                                            /* l = 1/(1/x-1)+1 + 1/(x-1) */
    CHECK(secp256k1_scalar_is_zero(&l));                                         /* l == 0 */
}